

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTSoundBank_Play(FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags,
                           int32_t timeOffset,FACTCue **ppCue)

{
  uint32_t uVar1;
  FACTCue *in_RAX;
  uint32_t dwFlags_00;
  FACTCue *result;
  FACTCue *local_28;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    uVar1 = 1;
    if (ppCue != (FACTCue **)0x0) {
      *ppCue = (FACTCue *)0x0;
    }
  }
  else {
    local_28 = in_RAX;
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    FACTSoundBank_Prepare(pSoundBank,nCueIndex,dwFlags_00,timeOffset,&local_28);
    if (ppCue == (FACTCue **)0x0) {
      local_28->managed = '\x01';
    }
    else {
      *ppCue = local_28;
    }
    FACTCue_Play(local_28);
    FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t FACTSoundBank_Play(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags,
	int32_t timeOffset,
	FACTCue** ppCue /* Optional! */
) {
	FACTCue *result;
	if (pSoundBank == NULL)
	{
		if (ppCue != NULL)
		{
			*ppCue = NULL;
		}
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	FACTSoundBank_Prepare(
		pSoundBank,
		nCueIndex,
		dwFlags,
		timeOffset,
		&result
	);
	if (ppCue != NULL)
	{
		*ppCue = result;
	}
	else
	{
		/* AKA we get to Destroy() this ourselves */
		result->managed = 1;
	}
	FACTCue_Play(result);

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}